

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ggml-cpu-quants.c
# Opt level: O0

void quantize_row_q8_1(float *x,void *vy,int64_t k)

{
  undefined1 auVar1 [16];
  undefined1 auVar2 [32];
  undefined1 auVar3 [32];
  undefined1 auVar4 [32];
  undefined1 auVar5 [32];
  undefined1 auVar6 [32];
  undefined1 auVar7 [32];
  undefined8 uVar8;
  undefined8 uVar9;
  undefined8 uVar10;
  undefined8 uVar11;
  __m256i a;
  undefined1 auVar12 [24];
  undefined1 auVar13 [24];
  undefined1 auVar14 [24];
  undefined1 auVar15 [24];
  int iVar16;
  undefined1 (*pauVar17) [32];
  undefined1 (*pauVar18) [32];
  undefined1 (*pauVar19) [32];
  long lVar20;
  long in_RDX;
  long in_RSI;
  undefined1 (*in_RDI) [32];
  undefined1 auVar21 [16];
  undefined1 auVar22 [16];
  __m256i perm;
  __m256i i3;
  __m256i i2;
  __m256i i1;
  __m256i i0;
  __m256 mul;
  float id;
  float d;
  float max_scalar;
  __m128 max4;
  __m256 maxAbs;
  __m256 signBit;
  __m256 v3;
  __m256 v2;
  __m256 v1;
  __m256 v0;
  int i;
  block_q8_1 *y;
  int nb;
  float local_968;
  undefined8 in_stack_fffffffffffff6b8;
  undefined1 in_stack_fffffffffffff6c0 [16];
  longlong in_stack_fffffffffffff6d0;
  undefined2 local_922;
  undefined8 local_8c0;
  undefined8 uStack_8b8;
  undefined8 uStack_8b0;
  undefined8 uStack_8a8;
  undefined1 local_800 [8];
  float fStack_7f8;
  float fStack_7f4;
  float fStack_7f0;
  float fStack_7ec;
  float fStack_7e8;
  undefined4 uStack_7e4;
  undefined1 local_7e0 [8];
  float fStack_7d8;
  float fStack_7d4;
  float fStack_7d0;
  float fStack_7cc;
  float fStack_7c8;
  undefined4 uStack_7c4;
  undefined1 local_7c0 [8];
  float fStack_7b8;
  float fStack_7b4;
  float fStack_7b0;
  float fStack_7ac;
  float fStack_7a8;
  undefined4 uStack_7a4;
  undefined1 local_7a0 [8];
  float fStack_798;
  float fStack_794;
  float fStack_790;
  float fStack_78c;
  float fStack_788;
  undefined4 uStack_784;
  int local_774;
  undefined1 (*local_750) [32];
  float local_4b0;
  float local_480;
  float fStack_47c;
  float fStack_478;
  float fStack_474;
  float fStack_470;
  float fStack_46c;
  float fStack_468;
  undefined4 uStack_464;
  float local_440;
  float fStack_43c;
  float fStack_438;
  float fStack_434;
  float fStack_430;
  float fStack_42c;
  float fStack_428;
  undefined4 uStack_424;
  float local_400;
  float fStack_3fc;
  float fStack_3f8;
  float fStack_3f4;
  float fStack_3f0;
  float fStack_3ec;
  float fStack_3e8;
  undefined4 uStack_3e4;
  float local_3e0;
  float fStack_3dc;
  float fStack_3d8;
  float fStack_3d4;
  float fStack_3d0;
  float fStack_3cc;
  float fStack_3c8;
  float local_3c0;
  float fStack_3bc;
  float fStack_3b8;
  float fStack_3b4;
  float fStack_3b0;
  float fStack_3ac;
  float fStack_3a8;
  undefined4 uStack_3a4;
  undefined8 uStack_f0;
  undefined8 uStack_e8;
  undefined8 uStack_b0;
  undefined8 uStack_a8;
  
  local_750 = in_RDI;
  for (local_774 = 0; local_774 < (int)(in_RDX / 0x20); local_774 = local_774 + 1) {
    auVar12 = *(undefined1 (*) [24])*local_750;
    uVar8 = *(undefined8 *)(*local_750 + 0x18);
    auVar7 = *local_750;
    pauVar17 = local_750 + 1;
    auVar13 = *(undefined1 (*) [24])*pauVar17;
    uVar9 = *(undefined8 *)(local_750[1] + 0x18);
    pauVar18 = local_750 + 2;
    auVar14 = *(undefined1 (*) [24])*pauVar18;
    uVar10 = *(undefined8 *)(local_750[2] + 0x18);
    pauVar19 = local_750 + 3;
    auVar15 = *(undefined1 (*) [24])*pauVar19;
    uVar11 = *(undefined8 *)(local_750[3] + 0x18);
    local_750 = local_750 + 4;
    auVar21 = vinsertps_avx(ZEXT416(0x80000000),ZEXT416(0x80000000),0x10);
    auVar21 = vinsertps_avx(auVar21,ZEXT416(0x80000000),0x20);
    auVar21 = vinsertps_avx(auVar21,ZEXT416(0x80000000),0x30);
    auVar1 = vinsertps_avx(ZEXT416(0x80000000),ZEXT416(0x80000000),0x10);
    auVar1 = vinsertps_avx(auVar1,ZEXT416(0x80000000),0x20);
    auVar1 = vinsertps_avx(auVar1,ZEXT416(0x80000000),0x30);
    uStack_b0 = auVar1._0_8_;
    uStack_a8 = auVar1._8_8_;
    auVar6._16_8_ = uStack_b0;
    auVar6._0_16_ = auVar21;
    auVar6._24_8_ = uStack_a8;
    auVar6 = vpandn_avx2(auVar6,auVar7);
    auVar3._16_8_ = uStack_b0;
    auVar3._0_16_ = auVar21;
    auVar3._24_8_ = uStack_a8;
    auVar7 = vpandn_avx2(auVar3,*pauVar17);
    auVar6 = vmaxps_avx(auVar6,auVar7);
    auVar2._16_8_ = uStack_b0;
    auVar2._0_16_ = auVar21;
    auVar2._24_8_ = uStack_a8;
    auVar7 = vpandn_avx2(auVar2,*pauVar18);
    auVar6 = vmaxps_avx(auVar6,auVar7);
    auVar7._16_8_ = uStack_b0;
    auVar7._0_16_ = auVar21;
    auVar7._24_8_ = uStack_a8;
    auVar7 = vpandn_avx2(auVar7,*pauVar19);
    auVar6 = vmaxps_avx(auVar6,auVar7);
    auVar21 = vmaxps_avx(auVar6._16_16_,auVar6._0_16_);
    auVar1 = vunpckhpd_avx(auVar21,auVar21);
    auVar21 = vmaxps_avx(auVar21,auVar1);
    auVar1 = vmovshdup_avx(auVar21);
    auVar21 = vmaxss_avx(auVar21,auVar1);
    local_4b0 = auVar21._0_4_;
    auVar21 = vcvtps2ph_f16c(ZEXT416((uint)(local_4b0 / 127.0)),0);
    *(short *)(in_RSI + (long)local_774 * 0x24) = auVar21._0_2_;
    if ((local_4b0 != 0.0) || (NAN(local_4b0))) {
      local_968 = 127.0 / local_4b0;
    }
    else {
      local_968 = 0.0;
    }
    auVar21 = vinsertps_avx(ZEXT416((uint)local_968),ZEXT416((uint)local_968),0x10);
    auVar21 = vinsertps_avx(auVar21,ZEXT416((uint)local_968),0x20);
    auVar21 = vinsertps_avx(auVar21,ZEXT416((uint)local_968),0x30);
    auVar1 = vinsertps_avx(ZEXT416((uint)local_968),ZEXT416((uint)local_968),0x10);
    auVar1 = vinsertps_avx(auVar1,ZEXT416((uint)local_968),0x20);
    auVar1 = vinsertps_avx(auVar1,ZEXT416((uint)local_968),0x30);
    local_3c0 = auVar12._0_4_;
    fStack_3bc = auVar12._4_4_;
    fStack_3b8 = auVar12._8_4_;
    fStack_3b4 = auVar12._12_4_;
    fStack_3b0 = auVar12._16_4_;
    fStack_3ac = auVar12._20_4_;
    fStack_3a8 = (float)uVar8;
    uStack_3a4 = (undefined4)((ulong)uVar8 >> 0x20);
    local_3e0 = auVar21._0_4_;
    fStack_3dc = auVar21._4_4_;
    fStack_3d8 = auVar21._8_4_;
    fStack_3d4 = auVar21._12_4_;
    fStack_3d0 = auVar1._0_4_;
    fStack_3cc = auVar1._4_4_;
    fStack_3c8 = auVar1._8_4_;
    local_7a0._4_4_ = fStack_3bc * fStack_3dc;
    local_7a0._0_4_ = local_3c0 * local_3e0;
    fStack_798 = fStack_3b8 * fStack_3d8;
    fStack_794 = fStack_3b4 * fStack_3d4;
    fStack_790 = fStack_3b0 * fStack_3d0;
    fStack_78c = fStack_3ac * fStack_3cc;
    fStack_788 = fStack_3a8 * fStack_3c8;
    uStack_784 = uStack_3a4;
    local_400 = auVar13._0_4_;
    fStack_3fc = auVar13._4_4_;
    fStack_3f8 = auVar13._8_4_;
    fStack_3f4 = auVar13._12_4_;
    fStack_3f0 = auVar13._16_4_;
    fStack_3ec = auVar13._20_4_;
    fStack_3e8 = (float)uVar9;
    uStack_3e4 = (undefined4)((ulong)uVar9 >> 0x20);
    local_7c0._4_4_ = fStack_3fc * fStack_3dc;
    local_7c0._0_4_ = local_400 * local_3e0;
    fStack_7b8 = fStack_3f8 * fStack_3d8;
    fStack_7b4 = fStack_3f4 * fStack_3d4;
    fStack_7b0 = fStack_3f0 * fStack_3d0;
    fStack_7ac = fStack_3ec * fStack_3cc;
    fStack_7a8 = fStack_3e8 * fStack_3c8;
    uStack_7a4 = uStack_3e4;
    local_440 = auVar14._0_4_;
    fStack_43c = auVar14._4_4_;
    fStack_438 = auVar14._8_4_;
    fStack_434 = auVar14._12_4_;
    fStack_430 = auVar14._16_4_;
    fStack_42c = auVar14._20_4_;
    fStack_428 = (float)uVar10;
    uStack_424 = (undefined4)((ulong)uVar10 >> 0x20);
    local_7e0._4_4_ = fStack_43c * fStack_3dc;
    local_7e0._0_4_ = local_440 * local_3e0;
    fStack_7d8 = fStack_438 * fStack_3d8;
    fStack_7d4 = fStack_434 * fStack_3d4;
    fStack_7d0 = fStack_430 * fStack_3d0;
    fStack_7cc = fStack_42c * fStack_3cc;
    fStack_7c8 = fStack_428 * fStack_3c8;
    uStack_7c4 = uStack_424;
    local_480 = auVar15._0_4_;
    fStack_47c = auVar15._4_4_;
    fStack_478 = auVar15._8_4_;
    fStack_474 = auVar15._12_4_;
    fStack_470 = auVar15._16_4_;
    fStack_46c = auVar15._20_4_;
    fStack_468 = (float)uVar11;
    uStack_464 = (undefined4)((ulong)uVar11 >> 0x20);
    local_800._4_4_ = fStack_47c * fStack_3dc;
    local_800._0_4_ = local_480 * local_3e0;
    fStack_7f8 = fStack_478 * fStack_3d8;
    fStack_7f4 = fStack_474 * fStack_3d4;
    fStack_7f0 = fStack_470 * fStack_3d0;
    fStack_7ec = fStack_46c * fStack_3cc;
    fStack_7e8 = fStack_468 * fStack_3c8;
    uStack_7e4 = uStack_464;
    auVar6 = vroundps_avx(_local_7a0,0);
    auVar7 = vroundps_avx(_local_7c0,0);
    auVar2 = vroundps_avx(_local_7e0,0);
    auVar3 = vroundps_avx(_local_800,0);
    auVar6 = vcvtps2dq_avx(auVar6);
    auVar7 = vcvtps2dq_avx(auVar7);
    auVar2 = vcvtps2dq_avx(auVar2);
    auVar3 = vcvtps2dq_avx(auVar3);
    auVar4 = vpaddd_avx2(auVar6,auVar7);
    auVar5 = vpaddd_avx2(auVar2,auVar3);
    vpaddd_avx2(auVar4,auVar5);
    a[1] = in_stack_fffffffffffff6c0._0_8_;
    a[2] = in_stack_fffffffffffff6c0._8_8_;
    a[0] = in_stack_fffffffffffff6b8;
    a[3] = in_stack_fffffffffffff6d0;
    iVar16 = hsum_i32_8(a);
    auVar21._0_12_ = ZEXT812(0);
    auVar21._12_4_ = 0;
    in_stack_fffffffffffff6c0 =
         vblendps_avx(auVar21,ZEXT416((uint)((local_4b0 / 127.0) * (float)iVar16)),1);
    auVar21 = vcvtps2ph_f16c(in_stack_fffffffffffff6c0,0);
    vpextrw_avx(auVar21,0);
    *(undefined2 *)(in_RSI + 2 + (long)local_774 * 0x24) = local_922;
    auVar6 = vpackssdw_avx2(auVar6,auVar7);
    auVar7 = vpackssdw_avx2(auVar2,auVar3);
    auVar6 = vpacksswb_avx2(auVar6,auVar7);
    auVar21 = vpinsrd_avx(ZEXT416(2),6,1);
    auVar21 = vpinsrd_avx(auVar21,3,2);
    auVar21 = vpinsrd_avx(auVar21,7,3);
    auVar1 = vpinsrd_avx(ZEXT416(0),4,1);
    auVar1 = vpinsrd_avx(auVar1,1,2);
    auVar1 = vpinsrd_avx(auVar1,5,3);
    auVar22 = ZEXT116(0) * SUB4816((undefined1  [48])0x0,0) + ZEXT116(1) * auVar21;
    uStack_f0 = auVar22._0_8_;
    uStack_e8 = auVar22._8_8_;
    auVar4._16_8_ = uStack_f0;
    auVar4._0_16_ = ZEXT116(0) * auVar21 + ZEXT116(1) * auVar1;
    auVar4._24_8_ = uStack_e8;
    auVar6 = vpermd_avx2(auVar4,auVar6);
    lVar20 = in_RSI + (long)local_774 * 0x24;
    local_8c0 = auVar6._0_8_;
    uStack_8b8 = auVar6._8_8_;
    uStack_8b0 = auVar6._16_8_;
    uStack_8a8 = auVar6._24_8_;
    *(undefined8 *)(lVar20 + 4) = local_8c0;
    *(undefined8 *)(lVar20 + 0xc) = uStack_8b8;
    *(undefined8 *)(lVar20 + 0x14) = uStack_8b0;
    *(undefined8 *)(lVar20 + 0x1c) = uStack_8a8;
    in_stack_fffffffffffff6b8 = uStack_e8;
  }
  return;
}

Assistant:

void quantize_row_q8_1(const float * GGML_RESTRICT x, void * GGML_RESTRICT vy, int64_t k) {
    assert(k % QK8_1 == 0);
    const int nb = k / QK8_1;

    block_q8_1 * GGML_RESTRICT y = vy;

#if defined(__ARM_NEON)
    for (int i = 0; i < nb; i++) {
        float32x4_t srcv [8];
        float32x4_t asrcv[8];
        float32x4_t amaxv[8];

        for (int j = 0; j < 8; j++) srcv[j]  = vld1q_f32(x + i*32 + 4*j);
        for (int j = 0; j < 8; j++) asrcv[j] = vabsq_f32(srcv[j]);

        for (int j = 0; j < 4; j++) amaxv[2*j] = vmaxq_f32(asrcv[2*j], asrcv[2*j+1]);
        for (int j = 0; j < 2; j++) amaxv[4*j] = vmaxq_f32(amaxv[4*j], amaxv[4*j+2]);
        for (int j = 0; j < 1; j++) amaxv[8*j] = vmaxq_f32(amaxv[8*j], amaxv[8*j+4]);

        const float amax = vmaxvq_f32(amaxv[0]);

        const float d = amax / ((1 << 7) - 1);
        const float id = d ? 1.0f/d : 0.0f;

        y[i].d = GGML_FP32_TO_FP16(d);

        int32x4_t accv = vdupq_n_s32(0);

        for (int j = 0; j < 8; j++) {
            const float32x4_t v  = vmulq_n_f32(srcv[j], id);
            const int32x4_t   vi = vcvtnq_s32_f32(v);

            y[i].qs[4*j + 0] = vgetq_lane_s32(vi, 0);
            y[i].qs[4*j + 1] = vgetq_lane_s32(vi, 1);
            y[i].qs[4*j + 2] = vgetq_lane_s32(vi, 2);
            y[i].qs[4*j + 3] = vgetq_lane_s32(vi, 3);

            accv = vaddq_s32(accv, vi);
        }

        y[i].s = GGML_FP32_TO_FP16(d * vaddvq_s32(accv));
    }
#elif defined __wasm_simd128__
    for (int i = 0; i < nb; i++) {
        v128_t srcv [8];
        v128_t asrcv[8];
        v128_t amaxv[8];

        for (int j = 0; j < 8; j++) srcv[j]  = wasm_v128_load(x + i*32 + 4*j);
        for (int j = 0; j < 8; j++) asrcv[j] = wasm_f32x4_abs(srcv[j]);

        for (int j = 0; j < 4; j++) amaxv[2*j] = wasm_f32x4_max(asrcv[2*j], asrcv[2*j+1]);
        for (int j = 0; j < 2; j++) amaxv[4*j] = wasm_f32x4_max(amaxv[4*j], amaxv[4*j+2]);
        for (int j = 0; j < 1; j++) amaxv[8*j] = wasm_f32x4_max(amaxv[8*j], amaxv[8*j+4]);

        const float amax = MAX(MAX(wasm_f32x4_extract_lane(amaxv[0], 0),
                                   wasm_f32x4_extract_lane(amaxv[0], 1)),
                               MAX(wasm_f32x4_extract_lane(amaxv[0], 2),
                                   wasm_f32x4_extract_lane(amaxv[0], 3)));

        const float d = amax / ((1 << 7) - 1);
        const float id = d ? 1.0f/d : 0.0f;

        y[i].d = GGML_FP32_TO_FP16(d);

        v128_t accv = wasm_i32x4_splat(0);

        for (int j = 0; j < 8; j++) {
            const v128_t v  = wasm_f32x4_mul(srcv[j], wasm_f32x4_splat(id));
            const v128_t vi = wasm_i32x4_trunc_sat_f32x4(v);

            y[i].qs[4*j + 0] = wasm_i32x4_extract_lane(vi, 0);
            y[i].qs[4*j + 1] = wasm_i32x4_extract_lane(vi, 1);
            y[i].qs[4*j + 2] = wasm_i32x4_extract_lane(vi, 2);
            y[i].qs[4*j + 3] = wasm_i32x4_extract_lane(vi, 3);

            accv = wasm_i32x4_add(accv, vi);
        }

        y[i].s = GGML_FP32_TO_FP16(
                d * (wasm_i32x4_extract_lane(accv, 0) +
                     wasm_i32x4_extract_lane(accv, 1) +
                     wasm_i32x4_extract_lane(accv, 2) +
                     wasm_i32x4_extract_lane(accv, 3)));
    }
#elif defined(__AVX2__) || defined(__AVX__)
    for (int i = 0; i < nb; i++) {
        // Load elements into 4 AVX vectors
        __m256 v0 = _mm256_loadu_ps( x );
        __m256 v1 = _mm256_loadu_ps( x + 8 );
        __m256 v2 = _mm256_loadu_ps( x + 16 );
        __m256 v3 = _mm256_loadu_ps( x + 24 );
        x += 32;

        // Compute max(abs(e)) for the block
        const __m256 signBit = _mm256_set1_ps( -0.0f );
        __m256 maxAbs = _mm256_andnot_ps( signBit, v0 );
        maxAbs = _mm256_max_ps( maxAbs, _mm256_andnot_ps( signBit, v1 ) );
        maxAbs = _mm256_max_ps( maxAbs, _mm256_andnot_ps( signBit, v2 ) );
        maxAbs = _mm256_max_ps( maxAbs, _mm256_andnot_ps( signBit, v3 ) );

        __m128 max4 = _mm_max_ps( _mm256_extractf128_ps( maxAbs, 1 ), _mm256_castps256_ps128( maxAbs ) );
        max4 = _mm_max_ps( max4, _mm_movehl_ps( max4, max4 ) );
        max4 = _mm_max_ss( max4, _mm_movehdup_ps( max4 ) );
        const float max_scalar = _mm_cvtss_f32( max4 );

        // Quantize these floats
        const float d = max_scalar / 127.f;
        y[i].d = GGML_FP32_TO_FP16(d);
        const float id = ( max_scalar != 0.0f ) ? 127.f / max_scalar : 0.0f;
        const __m256 mul = _mm256_set1_ps( id );

        // Apply the multiplier
        v0 = _mm256_mul_ps( v0, mul );
        v1 = _mm256_mul_ps( v1, mul );
        v2 = _mm256_mul_ps( v2, mul );
        v3 = _mm256_mul_ps( v3, mul );

        // Round to nearest integer
        v0 = _mm256_round_ps( v0, _MM_ROUND_NEAREST );
        v1 = _mm256_round_ps( v1, _MM_ROUND_NEAREST );
        v2 = _mm256_round_ps( v2, _MM_ROUND_NEAREST );
        v3 = _mm256_round_ps( v3, _MM_ROUND_NEAREST );

        // Convert floats to integers
        __m256i i0 = _mm256_cvtps_epi32( v0 );
        __m256i i1 = _mm256_cvtps_epi32( v1 );
        __m256i i2 = _mm256_cvtps_epi32( v2 );
        __m256i i3 = _mm256_cvtps_epi32( v3 );

#if defined(__AVX2__)
        // Compute the sum of the quants and set y[i].s
        y[i].s = GGML_FP32_TO_FP16(d * hsum_i32_8(_mm256_add_epi32(_mm256_add_epi32(i0, i1), _mm256_add_epi32(i2, i3))));

        // Convert int32 to int16
        i0 = _mm256_packs_epi32( i0, i1 );	// 0, 1, 2, 3,  8, 9, 10, 11,  4, 5, 6, 7, 12, 13, 14, 15
        i2 = _mm256_packs_epi32( i2, i3 );	// 16, 17, 18, 19,  24, 25, 26, 27,  20, 21, 22, 23, 28, 29, 30, 31
                                            // Convert int16 to int8
        i0 = _mm256_packs_epi16( i0, i2 );	// 0, 1, 2, 3,  8, 9, 10, 11,  16, 17, 18, 19,  24, 25, 26, 27,  4, 5, 6, 7, 12, 13, 14, 15, 20, 21, 22, 23, 28, 29, 30, 31

        // We got our precious signed bytes, but the order is now wrong
        // These AVX2 pack instructions process 16-byte pieces independently
        // The following instruction is fixing the order
        const __m256i perm = _mm256_setr_epi32( 0, 4, 1, 5, 2, 6, 3, 7 );
        i0 = _mm256_permutevar8x32_epi32( i0, perm );

        _mm256_storeu_si256((__m256i *)y[i].qs, i0);
#else
        // Since we don't have in AVX some necessary functions,
        // we split the registers in half and call AVX2 analogs from SSE
        __m128i ni0 = _mm256_castsi256_si128( i0 );
        __m128i ni1 = _mm256_extractf128_si256( i0, 1);
        __m128i ni2 = _mm256_castsi256_si128( i1 );
        __m128i ni3 = _mm256_extractf128_si256( i1, 1);
        __m128i ni4 = _mm256_castsi256_si128( i2 );
        __m128i ni5 = _mm256_extractf128_si256( i2, 1);
        __m128i ni6 = _mm256_castsi256_si128( i3 );
        __m128i ni7 = _mm256_extractf128_si256( i3, 1);

        // Compute the sum of the quants and set y[i].s
        const __m128i s0 = _mm_add_epi32(_mm_add_epi32(ni0, ni1), _mm_add_epi32(ni2, ni3));
        const __m128i s1 = _mm_add_epi32(_mm_add_epi32(ni4, ni5), _mm_add_epi32(ni6, ni7));
        y[i].s = GGML_FP32_TO_FP16(d * hsum_i32_4(_mm_add_epi32(s0, s1)));

        // Convert int32 to int16
        ni0 = _mm_packs_epi32( ni0, ni1 );
        ni2 = _mm_packs_epi32( ni2, ni3 );
        ni4 = _mm_packs_epi32( ni4, ni5 );
        ni6 = _mm_packs_epi32( ni6, ni7 );
        // Convert int16 to int8
        ni0 = _mm_packs_epi16( ni0, ni2 );
        ni4 = _mm_packs_epi16( ni4, ni6 );

        _mm_storeu_si128((__m128i *)(y[i].qs +  0), ni0);
        _mm_storeu_si128((__m128i *)(y[i].qs + 16), ni4);
#endif
    }
#elif defined(__riscv_v_intrinsic)

    size_t vl = QK8_1;

    for (int i = 0; i < nb; i++) {
        // load elements
        vfloat32m8_t v_x   = __riscv_vle32_v_f32m8(x+i*QK8_1, vl);

        vfloat32m8_t vfabs = __riscv_vfabs_v_f32m8(v_x, vl);
        vfloat32m1_t tmp   = __riscv_vfmv_v_f_f32m1(0.0, vl);
        vfloat32m1_t vmax  = __riscv_vfredmax_vs_f32m8_f32m1(vfabs, tmp, vl);
        float amax = __riscv_vfmv_f_s_f32m1_f32(vmax);

        const float d  = amax / ((1 << 7) - 1);
        const float id = d ? 1.0f/d : 0.0f;

        y[i].d = GGML_FP32_TO_FP16(d);

        vfloat32m8_t x0 = __riscv_vfmul_vf_f32m8(v_x, id, vl);

        // convert to integer
        vint16m4_t   vi = __riscv_vfncvt_x_f_w_i16m4(x0, vl);
        vint8m2_t    vs = __riscv_vncvt_x_x_w_i8m2(vi, vl);

        // store result
        __riscv_vse8_v_i8m2(y[i].qs , vs, vl);

        // compute sum for y[i].s
        vint16m1_t tmp2 = __riscv_vmv_v_x_i16m1(0, vl);
        vint16m1_t vwrs = __riscv_vwredsum_vs_i8m2_i16m1(vs, tmp2, vl);

        // set y[i].s
        int sum = __riscv_vmv_x_s_i16m1_i16(vwrs);
        y[i].s = GGML_FP32_TO_FP16(sum*d);
    }

#elif defined(__POWER9_VECTOR__)
    for (int i = 0; i < nb; i++) {
        vector float srcv [8];
        vector float asrcv[8];
        vector float amaxv[8];
        vector signed int vi[8];

        for (int j = 0; j < 8; j++) srcv[j]  = vec_xl(0, x + i*32 + 4*j);
        for (int j = 0; j < 8; j++) asrcv[j] = vec_abs(srcv[j]);

        for (int j = 0; j < 4; j++) amaxv[2*j] = vec_max(asrcv[2*j], asrcv[2*j+1]);
        for (int j = 0; j < 2; j++) amaxv[4*j] = vec_max(amaxv[4*j], amaxv[4*j+2]);
        for (int j = 0; j < 1; j++) amaxv[8*j] = vec_max(amaxv[8*j], amaxv[8*j+4]);

        const float amax = MAX(MAX(vec_extract(amaxv[0], 0),
                                   vec_extract(amaxv[0], 1)),
                               MAX(vec_extract(amaxv[0], 2),
                                   vec_extract(amaxv[0], 3)));

        const float d = amax / ((1 << 7) - 1);
        const float id = d ? 1.0f/d : 0.0f;
        const vector float vid = vec_splats(id);

        y[i].d = GGML_FP32_TO_FP16(d);

        vector int accv = vec_splats(0);

        for (int j = 0; j < 8; j++) {
            const vector float v  = vec_round(vec_mul(srcv[j], vid));
            vi[j] = vec_cts(v, 0);

            accv = vec_add(accv, vi[j]);
        }
        vec_xst(vec_pack(vec_pack(vi[0], vi[1]), vec_pack(vi[2], vi[3])),  0, &y[i].qs[0]);
        vec_xst(vec_pack(vec_pack(vi[4], vi[5]), vec_pack(vi[6], vi[7])), 16, &y[i].qs[0]);

        accv = vec_add(accv, vec_sld(accv, accv, 4));
        accv = vec_add(accv, vec_sld(accv, accv, 8));
        y[i].s = GGML_FP32_TO_FP16(d * vec_extract(accv, 0));
    }

#elif defined(__loongarch_asx)
    for (int i = 0; i < nb; i++) {
        __m256 v0 = (__m256)__lasx_xvld( x , 0 );
        __m256 v1 = (__m256)__lasx_xvld( x , 32 );
        __m256 v2 = (__m256)__lasx_xvld( x , 64 );
        __m256 v3 = (__m256)__lasx_xvld( x , 96 );
        x += 32;

        // Compute max(abs(e)) for the block
        const __m256 sign_bit = __lasx_xvreplfr2vr_s( -0.0f );
        __m256 max_abs = (__m256)__lasx_xvandn_v( (__m256i)sign_bit, (__m256i)v0 );
        max_abs = __lasx_xvfmax_s( max_abs, (__m256)__lasx_xvandn_v( (__m256i)sign_bit, (__m256i)v1 ) );
        max_abs = __lasx_xvfmax_s( max_abs, (__m256)__lasx_xvandn_v( (__m256i)sign_bit, (__m256i)v2 ) );
        max_abs = __lasx_xvfmax_s( max_abs, (__m256)__lasx_xvandn_v( (__m256i)sign_bit, (__m256i)v3 ) );

        __m128 max4 = __lsx_vfmax_s( lasx_extractf128( max_abs, 1 ), lasx_extractf128( max_abs, 0) );
        max4 = __lsx_vfmax_s( max4, (__m128)__lsx_vpickod_d((__m128i) max4, (__m128i)max4 ) );
        __m128 tmp = max4;
        max4 = __lsx_vfmax_s( max4, (__m128)__lsx_vextrins_w((__m128i)tmp, (__m128i)max4, 0x10 ));
        const float max_scalar = ((v4f32)max4)[0];

        // Quantize these floats
        const float d = max_scalar / 127.f;
        y[i].d = GGML_FP32_TO_FP16(d);
        const float id = ( max_scalar != 0.0f ) ? 127.f / max_scalar : 0.0f;
        const __m256 mul = __lasx_xvreplfr2vr_s( id );

        // Apply the multiplier
        v0 = __lasx_xvfmul_s( v0, mul );
        v1 = __lasx_xvfmul_s( v1, mul );
        v2 = __lasx_xvfmul_s( v2, mul );
        v3 = __lasx_xvfmul_s( v3, mul );

        // Round to nearest integer
        __m256i i0 = __lasx_xvftintrne_w_s( v0 );
        __m256i i1 = __lasx_xvftintrne_w_s( v1 );
        __m256i i2 = __lasx_xvftintrne_w_s( v2 );
        __m256i i3 = __lasx_xvftintrne_w_s( v3 );

        __m128i ni0 = lasx_extracti128(i0, 0);
        __m128i ni1 = lasx_extracti128( i0, 1);
        __m128i ni2 = lasx_extracti128( i1, 0);
        __m128i ni3 = lasx_extracti128( i1, 1);
        __m128i ni4 = lasx_extracti128( i2, 0 );
        __m128i ni5 = lasx_extracti128( i2, 1);
        __m128i ni6 = lasx_extracti128( i3, 0);
        __m128i ni7 = lasx_extracti128( i3, 1);

        // Compute the sum of the quants and set y[i].s
        const __m128i s0 = __lsx_vadd_w(__lsx_vadd_w(ni0, ni1), __lsx_vadd_w(ni2, ni3));
        const __m128i s1 = __lsx_vadd_w(__lsx_vadd_w(ni4, ni5), __lsx_vadd_w(ni6, ni7));
        y[i].s = GGML_FP32_TO_FP16(d * hsum_i32_4(__lsx_vadd_w(s0, s1)));

        // Convert int32 to int16
        ni0 = lsx_packs_w( ni0, ni1 );
        ni2 = lsx_packs_w( ni2, ni3 );
        ni4 = lsx_packs_w( ni4, ni5 );
        ni6 = lsx_packs_w( ni6, ni7 );
        // Convert int16 to int8
        ni0 = lsx_packs_h( ni0, ni2 );
        ni4 = lsx_packs_h( ni4, ni6 );

        __lsx_vst(ni0, (__m128i *)(y[i].qs +  0), 0);
        __lsx_vst(ni4, (__m128i *)(y[i].qs + 16), 0);
    }
#elif defined(__VXE__) || defined(__VXE2__)
    for (int i = 0; i < nb; i++) {
        __vector float srcv [8];
        __vector float asrcv[8];
        __vector float amaxv[8];

        for (int j = 0; j < 8; j++) srcv[j] = vec_xl(0, x + i*32 + 4*j);
        for (int j = 0; j < 8; j++) asrcv[j] = vec_abs(srcv[j]);
        for (int j = 0; j < 4; j++) amaxv[2*j] = vec_max(asrcv[2*j], asrcv[2*j+1]);
        for (int j = 0; j < 2; j++) amaxv[4*j] = vec_max(amaxv[4*j], amaxv[4*j+2]);
        for (int j = 0; j < 1; j++) amaxv[8*j] = vec_max(amaxv[8*j], amaxv[8*j+4]);

        const float amax = MAX(MAX(vec_extract(amaxv[0], 0),
                                   vec_extract(amaxv[0], 1)),
                               MAX(vec_extract(amaxv[0], 2),
                                   vec_extract(amaxv[0], 3)));

        const float d = amax / ((1 << 7) - 1);
        const float id = d ? 1.0f / d : 0.0f;

        y[i].d = GGML_FP32_TO_FP16(d);

        __vector int32_t acc = vec_splats(0);

        for (int j = 0; j < 8; j++) {
            const __vector float v = vec_mul(srcv[j], vec_splats(id));
            const __vector int32_t vi = vec_signed(v);

            y[i].qs[4*j + 0] = vec_extract(vi, 0);
            y[i].qs[4*j + 1] = vec_extract(vi, 1);
            y[i].qs[4*j + 2] = vec_extract(vi, 2);
            y[i].qs[4*j + 3] = vec_extract(vi, 3);

            acc = vec_add(acc, vi);
        }

        y[i].s = GGML_FP32_TO_FP16(d * (acc[0] + acc[1] + acc[2] + acc[3]));
    }
#else
    GGML_UNUSED(nb);
    // scalar
    quantize_row_q8_1_ref(x, y, k);
#endif
}